

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

bool __thiscall flatbuffers::TSGRPCGenerator::generate(TSGRPCGenerator *this)

{
  CodeWriter *this_00;
  ServiceDef *pSVar1;
  SymbolTable<flatbuffers::ServiceDef> *pSVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  Service *service;
  long lVar6;
  bool bVar7;
  long lVar8;
  string ts_interface_name;
  string ts_name;
  FlatBufFile file;
  string local_f8;
  undefined1 *local_d8;
  string local_d0;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  File local_50;
  Parser *local_48;
  string *local_40;
  undefined4 local_38;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  local_48 = (this->super_BaseGenerator).parser_;
  local_40 = (this->super_BaseGenerator).file_name_;
  local_50.super_CommentHolder._vptr_CommentHolder = (CommentHolder)&PTR__CommentHolder_003f42b8;
  local_38 = 5;
  iVar5 = (int)((ulong)((long)(local_48->services_).vec.
                              super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_48->services_).vec.
                             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar7 = iVar5 < 1;
  if (0 < iVar5) {
    local_d8 = &(this->code_).field_0x48;
    lVar8 = 0;
    do {
      pSVar2 = &local_48->services_;
      service = (Service *)operator_new(0x10);
      pSVar1 = (pSVar2->vec).
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar8];
      (service->super_CommentHolder)._vptr_CommentHolder =
           (_func_int **)&PTR__CommentHolder_003f4140;
      service[1].super_CommentHolder._vptr_CommentHolder = (_func_int **)pSVar1;
      grpc_ts_generator::Generate
                (&local_70,&local_50,service,(this->super_BaseGenerator).file_name_);
      CodeWriter::operator+=(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      GeneratedFileName(&local_d0,(this->super_BaseGenerator).path_,
                        (this->super_BaseGenerator).file_name_,false);
      _Var3._M_p = local_d0._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      bVar4 = SaveFile(_Var3._M_p,local_f8._M_dataplus._M_p,local_f8._M_string_length,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        (*(service->super_CommentHolder)._vptr_CommentHolder[1])(service);
        return bVar7;
      }
      CodeWriter::Clear(this_00);
      grpc_ts_generator::GenerateInterface
                (&local_90,&local_50,service,(this->super_BaseGenerator).file_name_);
      CodeWriter::operator+=(this_00,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      GeneratedFileName(&local_f8,(this->super_BaseGenerator).path_,
                        (this->super_BaseGenerator).file_name_,true);
      _Var3._M_p = local_f8._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      bVar4 = SaveFile(_Var3._M_p,(char *)local_b0,local_a8,false);
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      (*(service->super_CommentHolder)._vptr_CommentHolder[1])(service);
      if (!bVar4) {
        return bVar7;
      }
      lVar8 = lVar8 + 1;
      lVar6 = (long)(int)((ulong)((long)(local_48->services_).vec.
                                        super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_48->services_).vec.
                                       super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      bVar7 = lVar6 <= lVar8;
    } while (lVar8 < lVar6);
  }
  return bVar7;
}

Assistant:

bool generate() {
    code_.Clear();
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageTS);

    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      code_ += grpc_ts_generator::Generate(&file, service.get(), file_name_);
      const auto ts_name = GeneratedFileName(path_, file_name_);
      if (!SaveFile(ts_name.c_str(), code_.ToString(), false)) return false;

      code_.Clear();
      code_ += grpc_ts_generator::GenerateInterface(&file, service.get(),
                                                    file_name_);
      const auto ts_interface_name = GeneratedFileName(path_, file_name_, true);
      if (!SaveFile(ts_interface_name.c_str(), code_.ToString(), false))
        return false;
    }
    return true;
  }